

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DWrapper.cpp
# Opt level: O0

void __thiscall
Assimp::M3DWrapper::M3DWrapper
          (M3DWrapper *this,IOSystem *pIOHandler,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer)

{
  uchar *data;
  m3d_t *pmVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer_local;
  IOSystem *pIOHandler_local;
  M3DWrapper *this_local;
  
  this->m3d_ = (m3d_t *)0x0;
  this->saved_output_ = (uchar *)0x0;
  data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(buffer);
  pmVar1 = m3d_load(data,(m3dread_t)0x0,(m3dfree_t)0x0,(m3d_t *)0x0);
  this->m3d_ = pmVar1;
  return;
}

Assistant:

M3DWrapper::M3DWrapper(IOSystem *pIOHandler, const std::vector<unsigned char> &buffer) {
#ifdef ASSIMP_USE_M3D_READFILECB
	// pass this IOHandler to the C callback in a thread-local pointer
	m3dimporter_pIOHandler = pIOHandler;
	m3d_ = m3d_load(const_cast<unsigned char *>(buffer.data()), m3dimporter_readfile, free, nullptr);
	// Clear the C callback
	m3dimporter_pIOHandler = nullptr;
#else
	m3d_ = m3d_load(const_cast<unsigned char *>(buffer.data()), nullptr, nullptr, nullptr);
#endif
}